

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O3

gdImagePtr gdImageRotateNearestNeighbour(gdImagePtr src,float degrees,int bgColor)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  gdImagePtr pgVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  gdRect bbox;
  gdRect local_40;
  
  iVar1 = src->sx;
  iVar2 = src->sy;
  dVar12 = (double)((degrees / -180.0) * -3.1415927);
  dVar13 = cos(dVar12);
  dVar12 = sin(dVar12);
  gdRotatedImageSize(src,degrees,&local_40);
  pgVar4 = gdImageCreateTrueColor(local_40.width,local_40.height);
  if ((pgVar4 != (gdImagePtr)0x0) && (pgVar4->saveAlphaFlag = 1, (ulong)(uint)local_40.height != 0))
  {
    uVar10 = 0;
    do {
      if (local_40.width != 0) {
        lVar5 = (long)(((int)uVar10 - local_40.height / 2) * 0x100);
        piVar3 = pgVar4->tpixels[uVar10];
        lVar7 = 0;
        iVar8 = ((uint)(local_40.width - (local_40.width >> 0x1f)) >> 1) * -0x100;
        do {
          lVar11 = ((long)iVar8 * (long)(dVar12 * 256.0) >> 8) +
                   (lVar5 * (long)(dVar13 * 256.0) >> 8) +
                   (long)(int)((iVar2 - (iVar2 >> 0x1f) & 0xfffffffeU) << 7 | 0x80) >> 8;
          iVar6 = bgColor;
          if ((((0 < lVar11) && (lVar11 < (long)iVar2 + -1)) &&
              (lVar9 = ((long)iVar8 * (long)(dVar13 * 256.0) >> 8) +
                       ((long)(int)((iVar1 - (iVar1 >> 0x1f) & 0xfffffffeU) << 7 | 0x80) -
                       (lVar5 * (long)(dVar12 * 256.0) >> 8)) >> 8, 0 < lVar9)) &&
             (lVar9 < (long)iVar1 + -1)) {
            iVar6 = src->tpixels[lVar11][lVar9];
          }
          piVar3[lVar7] = iVar6;
          lVar7 = lVar7 + 1;
          iVar8 = iVar8 + 0x100;
        } while (local_40.width != (int)lVar7);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)local_40.height);
  }
  return pgVar4;
}

Assistant:

static gdImagePtr 
gdImageRotateNearestNeighbour(gdImagePtr src, const float degrees,
                              const int bgColor)
{
	float _angle = ((float) (-degrees / 180.0f) * (float)M_PI);
	const int src_w  = gdImageSX(src);
	const int src_h = gdImageSY(src);
	const gdFixed f_0_5 = gd_ftofx(0.5f);
	const gdFixed f_H = gd_itofx(src_h/2);
	const gdFixed f_W = gd_itofx(src_w/2);
	const gdFixed f_cos = gd_ftofx(cos(-_angle));
	const gdFixed f_sin = gd_ftofx(sin(-_angle));

	unsigned int dst_offset_x;
	unsigned int dst_offset_y = 0;
	unsigned int i;
	gdImagePtr dst;
	gdRect bbox;
	int new_height, new_width;

    gdRotatedImageSize(src, degrees, &bbox);
    new_width = bbox.width;
    new_height = bbox.height;

	dst = gdImageCreateTrueColor(new_width, new_height);
	if (!dst) {
		return NULL;
	}
	dst->saveAlphaFlag = 1;
	for (i = 0; i < new_height; i++) {
		unsigned int j;
		dst_offset_x = 0;
		for (j = 0; j < new_width; j++) {
			gdFixed f_i = gd_itofx((int)i - (int)new_height / 2);
			gdFixed f_j = gd_itofx((int)j - (int)new_width  / 2);
			gdFixed f_m = gd_mulfx(f_j,f_sin) + gd_mulfx(f_i,f_cos) + f_0_5 + f_H;
			gdFixed f_n = gd_mulfx(f_j,f_cos) - gd_mulfx(f_i,f_sin) + f_0_5 + f_W;
			long m = gd_fxtoi(f_m);
			long n = gd_fxtoi(f_n);

			if ((m > 0) && (m < src_h-1) && (n > 0) && (n < src_w-1)) {
				if (dst_offset_y < new_height) {
					dst->tpixels[dst_offset_y][dst_offset_x++] = src->tpixels[m][n];
				}
			} else {
				if (dst_offset_y < new_height) {
					dst->tpixels[dst_offset_y][dst_offset_x++] = bgColor;
				}
			}
		}
		dst_offset_y++;
	}
	return dst;
}